

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cmdline.c
# Opt level: O2

void test_cmdline(void)

{
  wchar_t wVar1;
  FILE *__stream;
  
  __stream = fopen("empty","wb");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'&',(uint)(__stream != (FILE *)0x0),"f != NULL",(void *)0x0);
  fclose(__stream);
  failure("-Q is an invalid option on every cpio program I know of");
  wVar1 = systemf("%s -i -Q <empty >1.out 2>1.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'*',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -i -Q <empty >1.out 2>1.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'+',"1.out");
  failure("-f requires an argument");
  wVar1 = systemf("%s -if <empty >2.out 2>2.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'.',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -if <empty >2.out 2>2.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'/',"2.out");
  failure("-f requires an argument");
  wVar1 = systemf("%s -i -f <empty >3.out 2>3.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'2',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -i -f <empty >3.out 2>3.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'3',"3.out");
  failure("--format requires an argument");
  wVar1 = systemf("%s -i --format <empty >4.out 2>4.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'6',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -i --format <empty >4.out 2>4.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'7',"4.out");
  failure("--badopt is an invalid option");
  wVar1 = systemf("%s -i --badop <empty >5.out 2>5.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L':',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -i --badop <empty >5.out 2>5.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L';',"5.out");
  failure("--badopt is an invalid option");
  wVar1 = systemf("%s -i --badopt <empty >6.out 2>6.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'>',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -i --badopt <empty >6.out 2>6.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'?',"6.out");
  failure("--n is ambiguous");
  wVar1 = systemf("%s -i --n <empty >7.out 2>7.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'B',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -i --n <empty >7.out 2>7.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'C',"7.out");
  failure("--create forbids an argument");
  wVar1 = systemf("%s --create=arg <empty >8.out 2>8.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'F',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s --create=arg <empty >8.out 2>8.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'G',"8.out");
  failure("-i with empty input should succeed");
  wVar1 = systemf("%s -i <empty >9.out 2>9.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'J',(uint)(wVar1 == L'\0'),
                   "0 == systemf(\"%s -i <empty >9.out 2>9.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'K',"9.out");
  failure("-o with empty input should succeed");
  wVar1 = systemf("%s -o <empty >10.out 2>10.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'N',(uint)(wVar1 == L'\0'),
                   "0 == systemf(\"%s -o <empty >10.out 2>10.err\", testprog)",(void *)0x0);
  failure("-i -p is nonsense");
  wVar1 = systemf("%s -i -p <empty >11.out 2>11.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'Q',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -i -p <empty >11.out 2>11.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'R',"11.out");
  failure("-p -i is nonsense");
  wVar1 = systemf("%s -p -i <empty >12.out 2>12.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'U',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -p -i <empty >12.out 2>12.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'V',"12.out");
  failure("-i -o is nonsense");
  wVar1 = systemf("%s -i -o <empty >13.out 2>13.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'Y',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -i -o <empty >13.out 2>13.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'Z',"13.out");
  failure("-o -i is nonsense");
  wVar1 = systemf("%s -o -i <empty >14.out 2>14.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L']',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -o -i <empty >14.out 2>14.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'^',"14.out");
  failure("-o -p is nonsense");
  wVar1 = systemf("%s -o -p <empty >15.out 2>15.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'a',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -o -p <empty >15.out 2>15.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'b',"15.out");
  failure("-p -o is nonsense");
  wVar1 = systemf("%s -p -o <empty >16.out 2>16.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'e',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -p -o <empty >16.out 2>16.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'f',"16.out");
  failure("-p with empty input should fail");
  wVar1 = systemf("%s -p <empty >17.out 2>17.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
                   ,L'i',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -p <empty >17.out 2>17.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_cmdline.c"
             ,L'j',"17.out");
  return;
}

Assistant:

DEFINE_TEST(test_cmdline)
{
	FILE *f;

	/* Create an empty file. */
	f = fopen("empty", "wb");
	assert(f != NULL);
	fclose(f);

	failure("-Q is an invalid option on every cpio program I know of");
	assert(0 != systemf("%s -i -Q <empty >1.out 2>1.err", testprog));
	assertEmptyFile("1.out");

	failure("-f requires an argument");
	assert(0 != systemf("%s -if <empty >2.out 2>2.err", testprog));
	assertEmptyFile("2.out");

	failure("-f requires an argument");
	assert(0 != systemf("%s -i -f <empty >3.out 2>3.err", testprog));
	assertEmptyFile("3.out");

	failure("--format requires an argument");
	assert(0 != systemf("%s -i --format <empty >4.out 2>4.err", testprog));
	assertEmptyFile("4.out");

	failure("--badopt is an invalid option");
	assert(0 != systemf("%s -i --badop <empty >5.out 2>5.err", testprog));
	assertEmptyFile("5.out");

	failure("--badopt is an invalid option");
	assert(0 != systemf("%s -i --badopt <empty >6.out 2>6.err", testprog));
	assertEmptyFile("6.out");

	failure("--n is ambiguous");
	assert(0 != systemf("%s -i --n <empty >7.out 2>7.err", testprog));
	assertEmptyFile("7.out");

	failure("--create forbids an argument");
	assert(0 != systemf("%s --create=arg <empty >8.out 2>8.err", testprog));
	assertEmptyFile("8.out");

	failure("-i with empty input should succeed");
	assert(0 == systemf("%s -i <empty >9.out 2>9.err", testprog));
	assertEmptyFile("9.out");

	failure("-o with empty input should succeed");
	assert(0 == systemf("%s -o <empty >10.out 2>10.err", testprog));

	failure("-i -p is nonsense");
	assert(0 != systemf("%s -i -p <empty >11.out 2>11.err", testprog));
	assertEmptyFile("11.out");

	failure("-p -i is nonsense");
	assert(0 != systemf("%s -p -i <empty >12.out 2>12.err", testprog));
	assertEmptyFile("12.out");

	failure("-i -o is nonsense");
	assert(0 != systemf("%s -i -o <empty >13.out 2>13.err", testprog));
	assertEmptyFile("13.out");

	failure("-o -i is nonsense");
	assert(0 != systemf("%s -o -i <empty >14.out 2>14.err", testprog));
	assertEmptyFile("14.out");

	failure("-o -p is nonsense");
	assert(0 != systemf("%s -o -p <empty >15.out 2>15.err", testprog));
	assertEmptyFile("15.out");

	failure("-p -o is nonsense");
	assert(0 != systemf("%s -p -o <empty >16.out 2>16.err", testprog));
	assertEmptyFile("16.out");

	failure("-p with empty input should fail");
	assert(0 != systemf("%s -p <empty >17.out 2>17.err", testprog));
	assertEmptyFile("17.out");
}